

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_test.cc
# Opt level: O2

void re2::RegexpCaptureNames(void)

{
  bool bVar1;
  int iVar2;
  Regexp *this;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__y;
  mapped_type *pmVar3;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  want;
  RegexpStatus status;
  LogMessageFatal local_190;
  
  status.code_ = kRegexpSuccess;
  status.error_arg_.ptr_ = (char *)0x0;
  status.error_arg_.length_ = 0;
  status.tmp_ = (string *)0x0;
  local_190.super_LogMessage._0_8_ = "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)";
  local_190.super_LogMessage._8_4_ = 0x23;
  this = Regexp::Parse((StringPiece *)&local_190,PerlX,&status);
  if (status.code_ != kRegexpSuccess) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x43);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: status.ok()");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  iVar2 = Regexp::NumCaptures(this);
  if (iVar2 != 4) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x44);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (4) == (x->NumCaptures())");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  __y = &Regexp::CaptureNames_abi_cxx11_(this)->_M_t;
  if (__y == (_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x46);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: have != NULL");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  if ((__y->_M_impl).super__Rb_tree_header._M_node_count != 3) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x47);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (3) == (have->size())");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  want._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &want._M_t._M_impl.super__Rb_tree_header._M_header;
  want._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  want._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  want._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190.super_LogMessage.severity_ = 1;
  want._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       want._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&want,(key_type *)&local_190);
  std::__cxx11::string::assign((char *)pmVar3);
  local_190.super_LogMessage.severity_ = 3;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&want,(key_type *)&local_190);
  std::__cxx11::string::assign((char *)pmVar3);
  local_190.super_LogMessage.severity_ = 4;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&want,(key_type *)&local_190);
  std::__cxx11::string::assign((char *)pmVar3);
  bVar1 = std::operator==(&want._M_t,__y);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x4d);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: (want) == (*have)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  Regexp::Decref(this);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(__y);
  operator_delete(__y);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&want._M_t);
  RegexpStatus::~RegexpStatus(&status);
  return;
}

Assistant:

TEST(Regexp, CaptureNames) {
  Regexp* x;
  RegexpStatus status;
  x = Regexp::Parse(
      "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)", Regexp::PerlX, &status);
  EXPECT_TRUE(status.ok());
  EXPECT_EQ(4, x->NumCaptures());
  const map<int, string>* have = x->CaptureNames();
  EXPECT_TRUE(have != NULL);
  EXPECT_EQ(3, have->size());
  map<int, string> want;
  want[1] = "g1";
  want[3] = "g2";
  want[4] = "g1";

  EXPECT_EQ(want, *have);
  x->Decref();
  delete have;
}